

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse4.c
# Opt level: O1

uint32_t aom_highbd_10_sub_pixel_avg_variance4x4_sse4_1
                   (uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int dst_stride,
                   uint32_t *sse,uint8_t *second_pred)

{
  uint uVar1;
  uint16_t temp2 [16];
  uint16_t fdata3 [20];
  undefined1 local_98 [32];
  uint16_t local_78 [16];
  uint16_t local_58 [20];
  
  aom_highbd_var_filter_block2d_bil_first_pass
            (src,local_58,src_stride,1,5,4,bilinear_filters_2t[xoffset]);
  aom_highbd_var_filter_block2d_bil_second_pass
            (local_58,local_78,4,4,4,4,bilinear_filters_2t[yoffset]);
  aom_highbd_comp_avg_pred_c
            ((uint8_t *)((ulong)local_98 >> 1),second_pred,4,4,(uint8_t *)((ulong)local_78 >> 1),4);
  uVar1 = (*aom_highbd_10_variance4x4)((uint8_t *)((ulong)local_98 >> 1),4,dst,dst_stride,sse);
  return uVar1;
}

Assistant:

uint32_t aom_highbd_10_sub_pixel_avg_variance4x4_sse4_1(
    const uint8_t *src, int src_stride, int xoffset, int yoffset,
    const uint8_t *dst, int dst_stride, uint32_t *sse,
    const uint8_t *second_pred) {
  uint16_t fdata3[(4 + 1) * 4];
  uint16_t temp2[4 * 4];
  DECLARE_ALIGNED(16, uint16_t, temp3[4 * 4]);

  aom_highbd_var_filter_block2d_bil_first_pass(
      src, fdata3, src_stride, 1, 4 + 1, 4, bilinear_filters_2t[xoffset]);
  aom_highbd_var_filter_block2d_bil_second_pass(fdata3, temp2, 4, 4, 4, 4,
                                                bilinear_filters_2t[yoffset]);

  aom_highbd_comp_avg_pred(CONVERT_TO_BYTEPTR(temp3), second_pred, 4, 4,
                           CONVERT_TO_BYTEPTR(temp2), 4);

  return aom_highbd_10_variance4x4(CONVERT_TO_BYTEPTR(temp3), 4, dst,
                                   dst_stride, sse);
}